

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernels.hpp
# Opt level: O2

double duckdb::CosineSimilarityOp::Operation<double>(double *lhs_data,double *rhs_data,idx_t count)

{
  double dVar1;
  double dVar2;
  idx_t i;
  idx_t iVar3;
  double *r_ptr;
  double *l_ptr;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    dVar1 = lhs_data[iVar3];
    dVar2 = rhs_data[iVar3];
    dVar6 = dVar6 + dVar1 * dVar2;
    dVar4 = dVar4 + dVar2 * dVar2;
    dVar5 = dVar5 + dVar1 * dVar1;
  }
  dVar5 = dVar5 * dVar4;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar4 = 1.0;
  if (dVar6 / dVar5 <= 1.0) {
    dVar4 = dVar6 / dVar5;
  }
  if (dVar4 <= -1.0) {
    dVar4 = -1.0;
  }
  return dVar4;
}

Assistant:

static TYPE Operation(const TYPE *lhs_data, const TYPE *rhs_data, const idx_t count) {

		TYPE distance = 0;
		TYPE norm_l = 0;
		TYPE norm_r = 0;

		auto l_ptr = lhs_data;
		auto r_ptr = rhs_data;

		for (idx_t i = 0; i < count; i++) {
			const auto x = *l_ptr++;
			const auto y = *r_ptr++;
			distance += x * y;
			norm_l += x * x;
			norm_r += y * y;
		}

		auto similarity = distance / std::sqrt(norm_l * norm_r);
		return std::max(static_cast<TYPE>(-1.0), std::min(similarity, static_cast<TYPE>(1.0)));
	}